

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O0

void extendFortress(PieceEnv *env,Piece *p,int offh,int offv,int turn,int corridor)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Piece *pPVar5;
  int iVar6;
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int unaff_retaddr;
  int unaff_retaddr_00;
  PieceEnv *in_stack_00000008;
  int max_1;
  int n;
  int max;
  int weight_tot;
  int valid;
  int typ1;
  int typ0;
  int facing;
  int depth;
  int i;
  int t;
  int z;
  int y;
  int x;
  undefined8 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int local_4c;
  int local_34;
  int local_30;
  int local_2c;
  int local_24;
  
  bVar1 = *(byte *)(in_RSI + 0x2c);
  iVar3 = 1;
  if (in_R9D != 0) {
    iVar3 = 7;
  }
  iVar6 = 6;
  if (in_R9D != 0) {
    iVar6 = 7;
  }
  local_4c = 0;
  if (in_R8D == 0) {
    (*(code *)(&DAT_0013e938 + *(int *)(&DAT_0013e938 + (ulong)bVar1 * 4)))();
    return;
  }
  if (in_R8D == -1) {
    if ((bVar1 & 1) == 0) {
      local_24 = *(int *)(in_RSI + 0x14) + -1;
      local_2c = *(int *)(in_RSI + 0x1c) + in_EDX;
    }
    else {
      local_24 = *(int *)(in_RSI + 0x14) + in_EDX;
      local_2c = *(int *)(in_RSI + 0x1c) + -1;
    }
  }
  else if (in_R8D == 1) {
    if ((bVar1 & 1) == 0) {
      local_24 = *(int *)(in_RSI + 0x20) + 1;
      local_2c = *(int *)(in_RSI + 0x1c) + in_EDX;
    }
    else {
      local_24 = *(int *)(in_RSI + 0x14) + in_EDX;
      local_2c = *(int *)(in_RSI + 0x28) + 1;
    }
  }
  iVar4 = local_24 - *(int *)(*in_RDI + 0x14);
  if (iVar4 < 1) {
    iVar4 = -iVar4;
  }
  if (iVar4 < 0x71) {
    iVar4 = local_2c - *(int *)(*in_RDI + 0x1c);
    if (iVar4 < 1) {
      iVar4 = -iVar4;
    }
    if (iVar4 < 0x71) {
      bVar2 = false;
      for (local_30 = iVar3; local_30 < iVar3 + iVar6; local_30 = local_30 + 1) {
        iVar4 = fortress_info[local_30].max;
        if ((iVar4 < 1) || (*(int *)((long)in_RDI + (long)local_30 * 4 + 0x2c) < iVar4)) {
          if (0 < iVar4) {
            bVar2 = true;
          }
          local_4c = fortress_info[local_30].weight + local_4c;
        }
      }
      if (((bVar2) && (0 < local_4c)) && (*(char *)(in_RSI + 0x2d) + 1 < 0x1f)) {
        for (local_34 = 0; local_34 < 5; local_34 = local_34 + 1) {
          in_stack_ffffffffffffffac =
               nextInt((uint64_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                       (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
          for (local_30 = iVar3; local_30 < iVar3 + iVar6; local_30 = local_30 + 1) {
            in_stack_ffffffffffffffa8 = fortress_info[local_30].max;
            if (((in_stack_ffffffffffffffa8 < 1) ||
                (*(int *)((long)in_RDI + (long)local_30 * 4 + 0x2c) < in_stack_ffffffffffffffa8)) &&
               (in_stack_ffffffffffffffac =
                     in_stack_ffffffffffffffac - fortress_info[local_30].weight,
               in_stack_ffffffffffffffac < 0)) {
              if ((*(int *)((long)in_RDI + 0x24) == local_30) &&
                 (fortress_info[local_30].repeatable == 0)) break;
              pPVar5 = addFortressPiece(in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                                        (int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                                        (int)((ulong)in_RSI >> 0x20),max_1,max);
              if (pPVar5 != (Piece *)0x0) {
                return;
              }
            }
          }
        }
      }
    }
  }
  addFortressPiece(in_stack_00000008,unaff_retaddr_00,unaff_retaddr,(int)((ulong)in_RDI >> 0x20),
                   (int)in_RDI,(int)((ulong)in_RSI >> 0x20),max_1,max);
  return;
}

Assistant:

static
void extendFortress(PieceEnv *env, Piece *p, int offh, int offv, int turn, int corridor)
{
    int x, y, z, t, i;
    int depth = p->depth + 1;
    int facing = p->rot;
    int typ0 = corridor ? CORRIDOR_STRAIGHT : BRIDGE_STRAIGHT;
    int typ1 = typ0 + (corridor ? 7 : 6);
    int valid = -1;
    int weight_tot = 0;

    y = p->bb0.y + offv;

    if (turn == 0) { // forward
        switch (facing) {
        case 0: x = p->bb0.x+offh; z = p->bb0.z-1;    break;
        case 1: x = p->bb1.x+1;    z = p->bb0.z+offh; break;
        case 2: x = p->bb0.x+offh; z = p->bb1.z+1;    break;
        case 3: x = p->bb0.x-1;    z = p->bb0.z+offh; break;
        default: UNREACHABLE();
        }
    } else if (turn == -1) { // left
        if (facing & 1) { x = p->bb0.x+offh; z = p->bb0.z-1;    facing = 0; }
        else            { x = p->bb0.x-1;    z = p->bb0.z+offh; facing = 3; }
    } else if (turn == +1) { // right
        if (facing & 1) { x = p->bb0.x+offh, z = p->bb1.z+1;    facing = 2; }
        else            { x = p->bb1.x+1;    z = p->bb0.z+offh; facing = 1; }
    } else UNREACHABLE();

    if (IABS(x - env->list->bb0.x) > 112 || IABS(z - env->list->bb0.z) > 112)
        goto L_end;

    for (valid = 0, t = typ0; t < typ1; t++)
    {
        int max = fortress_info[t].max;
        if (max > 0 && env->ntyp[t] >= max)
            continue;
        if (max > 0)
            valid = 1;
        weight_tot += fortress_info[t].weight;
    }

    if (valid == 0 || weight_tot <= 0 || depth > 30)
        goto L_end;

    for (i = 0; i < 5; i++)
    {
        int n = nextInt(env->rng, weight_tot);
        for (t = typ0; t < typ1; t++)
        {
            int max = fortress_info[t].max;
            if (max > 0 && env->ntyp[t] >= max)
                continue;
            n -= fortress_info[t].weight;
            if (n >= 0)
                continue;
            if (env->typlast == t && !fortress_info[t].repeatable)
                break;
            if (addFortressPiece(env, t, x, y, z, depth, facing, 1) != NULL)
                return;
        }
    }

L_end:
    addFortressPiece(env, FORTRESS_END, x, y, z, depth, facing, valid >= 0);
}